

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureUnitCase::init(TextureUnitCase *this,EVP_PKEY_CTX *ctx)

{
  int *value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
  *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  vector<int,_std::allocator<int>_> *this_03;
  ostringstream *this_04;
  ContextInfo *pCVar1;
  TestLog *pTVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  uint uVar3;
  bool bVar4;
  int iVar5;
  CaseType CVar6;
  deUint32 dVar7;
  int extraout_EAX;
  int *value_00;
  undefined4 *puVar8;
  TextureCube *this_05;
  Texture2D *this_06;
  Texture2DArray *this_07;
  Texture3D *this_08;
  pointer ppTVar9;
  _Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *p_Var10;
  MultiTexShader *this_09;
  byte bVar11;
  uint uVar12;
  int cellSize;
  long lVar13;
  int i;
  long lVar14;
  int iVar15;
  float fVar16;
  Random rnd;
  TextureFormat texFormat;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texScales;
  vector<glu::DataType,_std::allocator<glu::DataType>_> samplerTypes;
  RGBA local_2d4;
  Vec4 local_2d0;
  RGBA local_2c0;
  GLenum type;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texBiases;
  vector<int,_std::allocator<int>_> num2dArrayLayers;
  TextureFormat fmt;
  GLenum type_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unitTypes;
  Vector<float,_4> local_1d0;
  Vector<float,_4> local_1c0;
  TextureFormatInfo fmtInfo;
  
  iVar5 = this->m_numUnitsParam;
  if (iVar5 < 1) {
    pCVar1 = ((this->super_TestCase).m_context)->m_contextInfo;
    iVar5 = (*pCVar1->_vptr_ContextInfo[2])(pCVar1,0x8872);
  }
  this->m_numUnits = iVar5;
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deRandom_init(&rnd.m_rnd,this->m_randSeed);
  fVar16 = deRandom_getFloat(&rnd.m_rnd);
  value_00 = &this->m_numUnits;
  iVar5 = *value_00;
  if (0.7 <= fVar16) {
    iVar15 = iVar5 + -2;
    if (iVar15 < 2) {
      iVar15 = 1;
    }
    iVar5 = de::Random::getInt(&rnd,iVar15,iVar5);
  }
  this->m_numTextures = iVar5;
  this_04 = (ostringstream *)(fmtInfo.valueMin.m_data + 2);
  fmtInfo.valueMin.m_data._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(this_04);
  de::toString<int>((string *)&num2dArrayLayers,value_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samplerTypes,
                 "Using ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &num2dArrayLayers);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texBiases,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samplerTypes,
                 " texture unit(s) and ");
  value = &this->m_numTextures;
  de::toString<int>((string *)&fmt,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texScales,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texBiases,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fmt);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unitTypes,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texScales,
                 " texture(s)");
  std::operator<<((ostream *)this_04,
                  (char *)unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fmtInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&unitTypes);
  std::__cxx11::string::~string((string *)&texScales);
  std::__cxx11::string::~string((string *)&fmt);
  std::__cxx11::string::~string((string *)&texBiases);
  std::__cxx11::string::~string((string *)&samplerTypes);
  std::__cxx11::string::~string((string *)&num2dArrayLayers);
  std::__cxx11::ostringstream::~ostringstream(this_04);
  this_00 = &this->m_textureTypes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (this_00,(long)this->m_numTextures);
  this_01 = &this->m_textureParams;
  std::
  vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
  ::reserve(this_01,(long)this->m_numTextures);
  this_02 = &this->m_ndxTexType;
  std::vector<int,_std::allocator<int>_>::reserve(this_02,(long)this->m_numTextures);
  iVar5 = 0;
  do {
    iVar15 = 1;
    if (*value <= iVar5) {
      this_03 = &this->m_unitTextures;
      std::vector<int,_std::allocator<int>_>::reserve(this_03,(long)this->m_numUnits);
      fVar16 = 0.0;
      while (fmtInfo.valueMin.m_data[0] = fVar16, (int)fVar16 < *value) {
        std::vector<int,_std::allocator<int>_>::push_back(this_03,(value_type_conflict1 *)&fmtInfo);
        fVar16 = (float)((int)fmtInfo.valueMin.m_data[0] + 1);
      }
      while( true ) {
        last._M_current =
             (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        first._M_current =
             (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (this->m_numUnits <= (int)((ulong)((long)last._M_current - (long)first._M_current) >> 2))
        break;
        fVar16 = (float)de::Random::getInt(&rnd,0,*value + -1);
        fmtInfo.valueMin.m_data[0] = fVar16;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_03,(int *)&fmtInfo);
      }
      de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (&rnd,first,last);
      unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      texBiases.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&unitTypes,(long)*value_00);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
                (&texScales,(long)*value_00);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
                (&texBiases,(long)*value_00);
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::reserve
                (&samplerTypes,(long)*value_00);
      std::vector<int,_std::allocator<int>_>::reserve(&num2dArrayLayers,(long)*value_00);
      for (lVar14 = 0; lVar14 < *value_00; lVar14 = lVar14 + 1) {
        iVar5 = (this_03->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar14];
        type_1 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar5];
        fmt = glu::mapGLInternalFormat
                        ((this_01->
                         super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                         )._M_impl.super__Vector_impl_data._M_start[iVar5].internalFormat);
        tcu::getTextureFormatInfo(&fmtInfo,&fmt);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&unitTypes,&type_1);
        if (type_1 == 0x8c1a) {
          local_2d0.m_data[0] =
               (float)(this->m_textures2dArray).
                      super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [(this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[iVar5]]->m_numLayers;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&num2dArrayLayers,(int *)&local_2d0);
        }
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                  (&texScales,&fmtInfo.lookupScale);
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                  (&texBiases,&fmtInfo.lookupBias);
        if (type_1 == 0x8c1a) {
          local_2d0.m_data[0] = (float)glu::getSampler2DArrayType(fmt);
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                    (&samplerTypes,(DataType *)&local_2d0);
        }
        else if (type_1 == 0x806f) {
          local_2d0.m_data[0] = (float)glu::getSampler3DType(fmt);
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                    (&samplerTypes,(DataType *)&local_2d0);
        }
        else if (type_1 == 0x8513) {
          local_2d0.m_data[0] = (float)glu::getSamplerCubeType(fmt);
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                    (&samplerTypes,(DataType *)&local_2d0);
        }
        else if (type_1 == 0xde1) {
          local_2d0.m_data[0] = (float)glu::getSampler2DType(fmt);
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
                    (&samplerTypes,(DataType *)&local_2d0);
        }
      }
      this_09 = (MultiTexShader *)operator_new(0x1d0);
      dVar7 = deRandom_getUint32(&rnd.m_rnd);
      MultiTexShader::MultiTexShader
                (this_09,dVar7,*value_00,&unitTypes,&samplerTypes,&texScales,&texBiases,
                 &num2dArrayLayers);
      this->m_shader = this_09;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
                (&samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&texBiases.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&texScales.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return extraout_EAX;
    }
    CVar6 = this->m_caseType;
    if (CVar6 == CASE_MIXED) {
      CVar6 = deRandom_getUint32(&rnd.m_rnd);
      CVar6 = CVar6 & CASE_ONLY_3D;
    }
    type = 0x806f;
    if (CVar6 == CASE_ONLY_2D_ARRAY) {
      type = 0x8c1a;
    }
    if (CVar6 == CASE_ONLY_CUBE) {
      type = 0x8513;
    }
    uVar3 = (uint)(CVar6 == CASE_ONLY_2D_ARRAY) * 0x20 + 0x20;
    if (CVar6 == CASE_ONLY_CUBE) {
      uVar3 = 0x100;
    }
    if (CVar6 == CASE_ONLY_2D) {
      type = 0xde1;
    }
    uVar12 = uVar3;
    if (CVar6 == CASE_ONLY_2D) {
      uVar12 = 0x80;
    }
    if (CVar6 == CASE_ONLY_3D) {
      iVar15 = 0x20;
    }
    dVar7 = deRandom_getUint32(&rnd.m_rnd);
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(texScales.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           *(deUint32 *)(s_testSizedInternalFormats + ((ulong)dVar7 % 0x31) * 4));
    bVar4 = glu::isGLInternalColorFormatFilterable
                      (*(deUint32 *)(s_testSizedInternalFormats + ((ulong)dVar7 % 0x31) * 4));
    dVar7 = deRandom_getUint32(&rnd.m_rnd);
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(*(undefined4 *)(s_testWrapModes + ((ulong)dVar7 % 3) * 4),
                           (deUint32)
                           texScales.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    dVar7 = deRandom_getUint32(&rnd.m_rnd);
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(texScales.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           *(undefined4 *)(s_testWrapModes + ((ulong)dVar7 % 3) * 4));
    dVar7 = deRandom_getUint32(&rnd.m_rnd);
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(*(undefined4 *)(s_testWrapModes + ((ulong)dVar7 % 3) * 4),
                           texScales.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    if (bVar4) {
      dVar7 = deRandom_getUint32(&rnd.m_rnd);
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44((&s_testMagFilters)[dVar7 & 1],
                             texScales.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      dVar7 = deRandom_getUint32(&rnd.m_rnd);
      puVar8 = (undefined4 *)(s_testMinFilters + ((ulong)dVar7 % 6) * 4);
    }
    else {
      texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(0x2600,texScales.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      dVar7 = deRandom_getUint32(&rnd.m_rnd);
      puVar8 = (undefined4 *)((long)&s_testNearestMinFilters + (ulong)(dVar7 & 1) * 4);
    }
    texScales.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(texScales.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,*puVar8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&type);
    std::
    vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
    ::push_back(this_01,(value_type *)&texScales);
    texFormat = glu::mapGLInternalFormat
                          ((deUint32)
                           texScales.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    if (CVar6 == CASE_ONLY_2D) {
      fmtInfo.valueMin.m_data[0] =
           (float)((ulong)((long)(this->m_textures2d).
                                 super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_textures2d).
                                super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_02,(int *)&fmtInfo);
      this_06 = (Texture2D *)operator_new(0x50);
      tcu::Texture2D::Texture2D(this_06,&texFormat,uVar12,0x80);
      fmtInfo.valueMin.m_data._0_8_ = this_06;
      std::vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>>::emplace_back<tcu::Texture2D*>
                ((vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *)&this->m_textures2d,
                 (Texture2D **)&fmtInfo);
    }
    else if (CVar6 == CASE_ONLY_CUBE) {
      fmtInfo.valueMin.m_data[0] =
           (float)((ulong)((long)(this->m_texturesCube).
                                 super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_texturesCube).
                                super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_02,(int *)&fmtInfo);
      this_05 = (TextureCube *)operator_new(0x168);
      tcu::TextureCube::TextureCube(this_05,&texFormat,uVar12);
      fmtInfo.valueMin.m_data._0_8_ = this_05;
      std::vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>>::
      emplace_back<tcu::TextureCube*>
                ((vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *)
                 &this->m_texturesCube,(TextureCube **)&fmtInfo);
    }
    else if (CVar6 == CASE_ONLY_2D_ARRAY) {
      fmtInfo.valueMin.m_data[0] =
           (float)((ulong)((long)(this->m_textures2dArray).
                                 super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_textures2dArray).
                                super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_02,(int *)&fmtInfo);
      this_07 = (Texture2DArray *)operator_new(0x58);
      tcu::Texture2DArray::Texture2DArray(this_07,&texFormat,uVar12,uVar3,4);
      fmtInfo.valueMin.m_data._0_8_ = this_07;
      std::vector<tcu::Texture2DArray*,std::allocator<tcu::Texture2DArray*>>::
      emplace_back<tcu::Texture2DArray*>
                ((vector<tcu::Texture2DArray*,std::allocator<tcu::Texture2DArray*>> *)
                 &this->m_textures2dArray,(Texture2DArray **)&fmtInfo);
    }
    else {
      fmtInfo.valueMin.m_data[0] =
           (float)((ulong)((long)(this->m_textures3d).
                                 super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_textures3d).
                                super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_02,(int *)&fmtInfo);
      this_08 = (Texture3D *)operator_new(0x58);
      tcu::Texture3D::Texture3D(this_08,&texFormat,uVar12,uVar3,iVar15);
      fmtInfo.valueMin.m_data._0_8_ = this_08;
      std::vector<tcu::Texture3D*,std::allocator<tcu::Texture3D*>>::emplace_back<tcu::Texture3D*>
                ((vector<tcu::Texture3D*,std::allocator<tcu::Texture3D*>> *)&this->m_textures3d,
                 (Texture3D **)&fmtInfo);
    }
    tcu::getTextureFormatInfo(&fmtInfo,&texFormat);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&texBiases,&fmtInfo.valueMin);
    tcu::operator-((tcu *)&samplerTypes,&fmtInfo.valueMax,&fmtInfo.valueMin);
    uVar3 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    for (lVar14 = 0; lVar14 != (ulong)(CVar6 == CASE_ONLY_CUBE) * 5 + 1; lVar14 = lVar14 + 1) {
      dVar7 = deRandom_getUint32(&rnd.m_rnd);
      iVar15 = 0;
      for (lVar13 = 0; (ulong)((uVar3 ^ 0xffffffe0) + 0x21) * 0x28 != lVar13; lVar13 = lVar13 + 0x28
          ) {
        bVar11 = (byte)iVar15;
        if (CVar6 == CASE_ONLY_2D) {
          tcu::Texture2D::allocLevel
                    ((this->m_textures2d).
                     super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl
                     .super__Vector_impl_data._M_finish[-1],iVar15);
          uVar12 = 8 >> (bVar11 & 0x1f);
          cellSize = uVar12 + (uVar12 == 0);
          ppTVar9 = (pointer)(this->m_textures2d).
                             super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
LAB_01056d72:
          p_Var10 = &(ppTVar9[-1]->super_TextureLevelPyramid).m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
          ;
        }
        else {
          if (CVar6 != CASE_ONLY_CUBE) {
            if (CVar6 == CASE_ONLY_2D_ARRAY) {
              tcu::Texture2DArray::allocLevel
                        ((this->m_textures2dArray).
                         super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1],iVar15);
              uVar12 = 8 >> (bVar11 & 0x1f);
              cellSize = uVar12 + (uVar12 == 0);
              ppTVar9 = (pointer)(this->m_textures2dArray).
                                 super__Vector_base<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              tcu::Texture3D::allocLevel
                        ((this->m_textures3d).
                         super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish[-1],iVar15);
              uVar12 = 8 >> (bVar11 & 0x1f);
              cellSize = uVar12 + (uVar12 == 0);
              ppTVar9 = (this->m_textures3d).
                        super__Vector_base<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            goto LAB_01056d72;
          }
          tcu::TextureCube::allocLevel
                    ((this->m_texturesCube).
                     super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1],(CubeFace)lVar14,iVar15);
          uVar12 = 8 >> (bVar11 & 0x1f);
          cellSize = uVar12 + (uVar12 == 0);
          p_Var10 = &(this->m_texturesCube).
                     super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1]->m_access[lVar14].
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
          ;
        }
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&unitTypes,
                   (ConstPixelBufferAccess *)
                   ((long)(((p_Var10->_M_impl).super__Vector_impl_data._M_start)->
                          super_ConstPixelBufferAccess).m_size.m_data + lVar13 + -8));
        local_2c0.m_value = dVar7 | 0xff000000;
        tcu::RGBA::toVec(&local_2c0);
        tcu::operator*((tcu *)&fmt,(Vector<float,_4> *)&type_1,(Vector<float,_4> *)&samplerTypes);
        tcu::operator+((tcu *)&num2dArrayLayers,(Vector<float,_4> *)&fmt,
                       (Vector<float,_4> *)&texBiases);
        local_2d4.m_value = ~dVar7 | 0xff000000;
        tcu::RGBA::toVec(&local_2d4);
        tcu::operator*((tcu *)&local_1c0,&local_1d0,(Vector<float,_4> *)&samplerTypes);
        tcu::operator+((tcu *)&local_2d0,&local_1c0,(Vector<float,_4> *)&texBiases);
        tcu::fillWithGrid((PixelBufferAccess *)&unitTypes,cellSize,(Vec4 *)&num2dArrayLayers,
                          &local_2d0);
        iVar15 = iVar15 + 1;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void TextureUnitCase::init (void)
{
	m_numUnits = m_numUnitsParam > 0 ? m_numUnitsParam : m_context.getContextInfo().getInt(GL_MAX_TEXTURE_IMAGE_UNITS);

	// Make the textures.

	try
	{
		tcu::TestLog&	log	= m_testCtx.getLog();
		de::Random		rnd	(m_randSeed);

		if (rnd.getFloat() < 0.7f)
			m_numTextures = m_numUnits;											// In most cases use one unit per texture.
		else
			m_numTextures = rnd.getInt(deMax32(1, m_numUnits - 2), m_numUnits);	// Sometimes assign same texture to multiple units.

		log << tcu::TestLog::Message << ("Using " + de::toString(m_numUnits) + " texture unit(s) and " + de::toString(m_numTextures) + " texture(s)").c_str() << tcu::TestLog::EndMessage;

		m_textureTypes.reserve(m_numTextures);
		m_textureParams.reserve(m_numTextures);
		m_ndxTexType.reserve(m_numTextures);

		// Generate textures.

		for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		{
			// Either fixed or randomized target types, and randomized parameters for every texture.

			TextureParameters	params;

			DE_STATIC_ASSERT(CASE_ONLY_2D == 0 && CASE_MIXED + 1 == CASE_LAST);

			int						texType			= m_caseType == CASE_MIXED ? rnd.getInt(0, (int)CASE_MIXED - 1) : (int)m_caseType;
			bool					is2dTex			= texType == 0;
			bool					isCubeTex		= texType == 1;
			bool					is2dArrayTex	= texType == 2;
			bool					is3dTex			= texType == 3;

			DE_ASSERT(is2dTex || isCubeTex || is2dArrayTex || is3dTex);

			GLenum					type			= is2dTex		? GL_TEXTURE_2D		: isCubeTex ? GL_TEXTURE_CUBE_MAP	: is2dArrayTex ? GL_TEXTURE_2D_ARRAY		: GL_TEXTURE_3D;
			const int				texWidth		= is2dTex		? TEXTURE_WIDTH_2D	: isCubeTex ? TEXTURE_WIDTH_CUBE	: is2dArrayTex ? TEXTURE_WIDTH_2D_ARRAY		: TEXTURE_WIDTH_3D;
			const int				texHeight		= is2dTex		? TEXTURE_HEIGHT_2D	: isCubeTex ? TEXTURE_HEIGHT_CUBE	: is2dArrayTex ? TEXTURE_HEIGHT_2D_ARRAY	: TEXTURE_HEIGHT_3D;

			const int				texDepth		= is3dTex ? TEXTURE_DEPTH_3D : 1;
			const int				texLayers		= is2dArrayTex ? TEXTURE_LAYERS_2D_ARRAY : 1;

			bool					mipmaps			= (deIsPowerOfTwo32(texWidth) && deIsPowerOfTwo32(texHeight) && deIsPowerOfTwo32(texDepth));
			int						numLevels		= mipmaps ? deLog2Floor32(de::max(de::max(texWidth, texHeight), texDepth))+1 : 1;

			params.internalFormat = s_testSizedInternalFormats[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testSizedInternalFormats) - 1)];

			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(params.internalFormat);

			params.wrapModeS = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeT = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeR = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];

			params.magFilter = isFilterable ? s_testMagFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMagFilters) - 1)] : GL_NEAREST;

			if (mipmaps)
				params.minFilter = isFilterable ?
					s_testMinFilters			[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMinFilters) - 1)] :
					s_testNearestMinFilters		[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNearestMinFilters) - 1)];
			else
				params.minFilter = isFilterable ?
					s_testNonMipmapMinFilters	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNonMipmapMinFilters) - 1)] :
					GL_NEAREST;

			m_textureTypes.push_back(type);
			m_textureParams.push_back(params);

			// Create new texture.

			tcu::TextureFormat texFormat = glu::mapGLInternalFormat((deUint32)params.internalFormat);

			if (is2dTex)
			{
				m_ndxTexType.push_back((int)m_textures2d.size()); // Remember the index this texture has in the 2d texture vector.
				m_textures2d.push_back(new tcu::Texture2D(texFormat, texWidth, texHeight));
			}
			else if (isCubeTex)
			{
				m_ndxTexType.push_back((int)m_texturesCube.size()); // Remember the index this texture has in the cube texture vector.
				DE_ASSERT(texWidth == texHeight);
				m_texturesCube.push_back(new tcu::TextureCube(texFormat, texWidth));
			}
			else if (is2dArrayTex)
			{
				m_ndxTexType.push_back((int)m_textures2dArray.size()); // Remember the index this texture has in the 2d array texture vector.
				m_textures2dArray.push_back(new tcu::Texture2DArray(texFormat, texWidth, texHeight, texLayers));
			}
			else
			{
				m_ndxTexType.push_back((int)m_textures3d.size()); // Remember the index this texture has in the 3d vector.
				m_textures3d.push_back(new tcu::Texture3D(texFormat, texWidth, texHeight, texDepth));
			}

			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFormat);
			Vec4					cBias		= fmtInfo.valueMin;
			Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill with grid texture.

			int numFaces = isCubeTex ? (int)tcu::CUBEFACE_LAST : 1;

			for (int face = 0; face < numFaces; face++)
			{
				deUint32 rgb	= rnd.getUint32() & 0x00ffffff;
				deUint32 alpha	= 0xff000000;

				deUint32 colorA = alpha | rgb;
				deUint32 colorB = alpha | ((~rgb) & 0x00ffffff);

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					if (is2dTex)
						m_textures2d.back()->allocLevel(levelNdx);
					else if (isCubeTex)
						m_texturesCube.back()->allocLevel((tcu::CubeFace)face, levelNdx);
					else if (is2dArrayTex)
						m_textures2dArray.back()->allocLevel(levelNdx);
					else
						m_textures3d.back()->allocLevel(levelNdx);

					int curCellSize = deMax32(1, GRID_CELL_SIZE >> levelNdx); // \note Scale grid cell size for mipmaps.

					tcu::PixelBufferAccess access = is2dTex			? m_textures2d.back()->getLevel(levelNdx)
												  : isCubeTex		? m_texturesCube.back()->getLevelFace(levelNdx, (tcu::CubeFace)face)
												  : is2dArrayTex	? m_textures2dArray.back()->getLevel(levelNdx)
												  :					  m_textures3d.back()->getLevel(levelNdx);

					tcu::fillWithGrid(access, curCellSize, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
				}
			}
		}

		// Assign a texture index to each unit.

		m_unitTextures.reserve(m_numUnits);

		// \note Every texture is used at least once.
		for (int i = 0; i < m_numTextures; i++)
			m_unitTextures.push_back(i);

		// Assign a random texture to remaining units.
		while ((int)m_unitTextures.size() < m_numUnits)
			m_unitTextures.push_back(rnd.getInt(0, m_numTextures - 1));

		rnd.shuffle(m_unitTextures.begin(), m_unitTextures.end());

		// Generate information for shader.

		vector<GLenum>			unitTypes;
		vector<Vec4>			texScales;
		vector<Vec4>			texBiases;
		vector<glu::DataType>	samplerTypes;
		vector<int>				num2dArrayLayers;

		unitTypes.reserve(m_numUnits);
		texScales.reserve(m_numUnits);
		texBiases.reserve(m_numUnits);
		samplerTypes.reserve(m_numUnits);
		num2dArrayLayers.reserve(m_numUnits);

		for (int i = 0; i < m_numUnits; i++)
		{
			int						texNdx		= m_unitTextures[i];
			GLenum					type		= m_textureTypes[texNdx];
			tcu::TextureFormat		fmt			= glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat);
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(fmt);

			unitTypes.push_back(type);

			if (type == GL_TEXTURE_2D_ARRAY)
				num2dArrayLayers.push_back(m_textures2dArray[m_ndxTexType[texNdx]]->getNumLayers());

			texScales.push_back(fmtInfo.lookupScale);
			texBiases.push_back(fmtInfo.lookupBias);

			switch (type)
			{
				case GL_TEXTURE_2D:			samplerTypes.push_back(glu::getSampler2DType(fmt));			break;
				case GL_TEXTURE_CUBE_MAP:	samplerTypes.push_back(glu::getSamplerCubeType(fmt));		break;
				case GL_TEXTURE_2D_ARRAY:	samplerTypes.push_back(glu::getSampler2DArrayType(fmt));	break;
				case GL_TEXTURE_3D:			samplerTypes.push_back(glu::getSampler3DType(fmt));			break;
				default:
					DE_ASSERT(DE_FALSE);
			}
		}

		// Create shader.

		DE_ASSERT(m_shader == DE_NULL);
		m_shader = new MultiTexShader(rnd.getUint32(), m_numUnits, unitTypes, samplerTypes, texScales, texBiases, num2dArrayLayers);
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureUnitCase::deinit();
		throw;
	}
}